

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_FileIo_Test::TestBody(IoTest_FileIo_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  bool read_eof;
  ZeroCopyOutputStream *output_00;
  char *pcVar1;
  _func_int *p_Var2;
  long lVar3;
  int file;
  FileOutputStream output;
  string filename;
  uint local_10c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  AlphaNum *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_a8 [8];
  CopyingFileInputStream local_a0;
  CopyingInputStreamAdaptor local_88;
  string local_50;
  
  testing::TempDir_abi_cxx11_();
  local_a8 = (undefined1  [8])local_100;
  local_a0.super_CopyingInputStream._vptr_CopyingInputStream = (_func_int **)local_108._M_head_impl;
  local_d8 = (undefined1  [8])0x1b;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1219d47;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_50,(lts_20250127 *)local_a8,(AlphaNum *)local_d8,local_100);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._M_head_impl !=
      &local_f8) {
    operator_delete(local_108._M_head_impl,(ulong)(local_f8._M_dataplus._M_p + 1));
  }
  this_00 = &local_f8.field_2;
  local_f8.field_2._8_8_ = 0;
  do {
    lVar3 = 0;
    do {
      local_10c = open(local_50._M_dataplus._M_p,0x242,0x1ff);
      local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_a8,"file","0",(int *)&local_10c,(int *)local_d8);
      if (local_a8[0] == (lts_20250127)0x0) {
        testing::Message::Message((Message *)local_d8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0.super_CopyingInputStream._vptr_CopyingInputStream ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          p_Var2 = (_func_int *)(anon_var_dwarf_a22956 + 5);
        }
        else {
          p_Var2 = *local_a0.super_CopyingInputStream._vptr_CopyingInputStream;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x586,(char *)p_Var2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_d8);
LAB_00b45021:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
        if (local_d8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_d8 + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0.super_CopyingInputStream._vptr_CopyingInputStream !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_a8 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_a0.super_CopyingInputStream._vptr_CopyingInputStream);
        }
        goto LAB_00b4504f;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_a0.super_CopyingInputStream._vptr_CopyingInputStream !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a0.super_CopyingInputStream._vptr_CopyingInputStream);
      }
      output_00 = (ZeroCopyOutputStream *)(ulong)local_10c;
      FileOutputStream::FileOutputStream
                ((FileOutputStream *)local_a8,local_10c,
                 (&io::(anonymous_namespace)::IoTest::kBlockSizes)[local_f8.field_2._8_8_]);
      IoTest::WriteStuff((IoTest *)local_a8,output_00);
      local_108._M_head_impl = local_108._M_head_impl & 0xffffffff00000000;
      local_f8.field_2._M_allocated_capacity._0_4_ =
           local_88.buffer_._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d8,"0","output.GetErrno()",(int *)&local_108,
                 (int *)this_00->_M_local_buf);
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        pcVar1 = anon_var_dwarf_a22956 + 5;
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = (local_d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&this_00->_M_allocated_capacity,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x58b,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&this_00->_M_allocated_capacity,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)&this_00->_M_allocated_capacity);
        if (local_108._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_108._M_head_impl + 8))();
        }
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      FileOutputStream::~FileOutputStream((FileOutputStream *)local_a8);
      local_d8 = (undefined1  [8])lseek(local_10c,0,0);
      local_108._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0xffffffffffffffff;
      testing::internal::CmpHelperNE<long,long>
                ((internal *)local_a8,"lseek(file, 0, 0)","(off_t)-1",(long *)local_d8,
                 (long *)&local_108);
      if (local_a8[0] == (lts_20250127)0x0) {
        testing::Message::Message((Message *)local_d8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_a0.super_CopyingInputStream._vptr_CopyingInputStream ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          p_Var2 = (_func_int *)(anon_var_dwarf_a22956 + 5);
        }
        else {
          p_Var2 = *local_a0.super_CopyingInputStream._vptr_CopyingInputStream;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x58f,(char *)p_Var2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_d8);
        goto LAB_00b45021;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_a0.super_CopyingInputStream._vptr_CopyingInputStream !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a0.super_CopyingInputStream._vptr_CopyingInputStream);
      }
      FileInputStream::FileInputStream
                ((FileInputStream *)local_a8,local_10c,
                 *(int *)((long)&io::(anonymous_namespace)::IoTest::kBlockSizes + lVar3));
      IoTest::ReadStuff((IoTest *)local_a8,(ZeroCopyInputStream *)0x1,read_eof);
      local_108._M_head_impl = local_108._M_head_impl & 0xffffffff00000000;
      local_f8.field_2._M_allocated_capacity._0_4_ = local_a0.errno_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d8,"0","input.GetErrno()",(int *)&local_108,
                 (int *)this_00->_M_local_buf);
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        pcVar1 = anon_var_dwarf_a22956 + 5;
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = (local_d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&this_00->_M_allocated_capacity,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x594,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&this_00->_M_allocated_capacity,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)&this_00->_M_allocated_capacity);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_108._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_108._M_head_impl + 8))();
        }
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor
                ((CopyingInputStreamAdaptor *)(local_a8 + 0x20));
      FileInputStream::CopyingFileInputStream::~CopyingFileInputStream
                ((CopyingFileInputStream *)(local_a8 + 8));
      close(local_10c);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    local_f8.field_2._8_8_ = local_f8.field_2._8_8_ + 1;
  } while (local_f8.field_2._8_8_ != 8);
LAB_00b4504f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(IoTest, FileIo) {
  std::string filename =
      absl::StrCat(::testing::TempDir(), "/zero_copy_stream_test_file");

  for (int i = 0; i < kBlockSizeCount; i++) {
    for (int j = 0; j < kBlockSizeCount; j++) {
      // Make a temporary file.
      int file =
          open(filename.c_str(), O_RDWR | O_CREAT | O_TRUNC | O_BINARY, 0777);
      ASSERT_GE(file, 0);

      {
        FileOutputStream output(file, kBlockSizes[i]);
        WriteStuff(&output);
        EXPECT_EQ(0, output.GetErrno());
      }

      // Rewind.
      ASSERT_NE(lseek(file, 0, SEEK_SET), (off_t)-1);

      {
        FileInputStream input(file, kBlockSizes[j]);
        ReadStuff(&input);
        EXPECT_EQ(0, input.GetErrno());
      }

      close(file);
    }
  }
}